

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::RegexMatcher::setTimeLimit(RegexMatcher *this,int32_t limit,UErrorCode *status)

{
  if (U_ZERO_ERROR < *status) {
    return;
  }
  if (U_ZERO_ERROR < this->fDeferredStatus) {
    *status = this->fDeferredStatus;
    return;
  }
  if (-1 < limit) {
    this->fTimeLimit = limit;
    return;
  }
  *status = U_ILLEGAL_ARGUMENT_ERROR;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }